

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_path_rect_to(nk_draw_list *list,nk_vec2 a,nk_vec2 b,float rounding)

{
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_vec2 pos_01;
  nk_vec2 pos_02;
  nk_vec2 pos_03;
  nk_vec2 pos_04;
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar7 = b.x;
  fVar8 = b.y;
  fVar3 = a.x;
  fVar5 = a.y;
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x2760,
                  "void nk_draw_list_path_rect_to(struct nk_draw_list *, struct nk_vec2, struct nk_vec2, float)"
                 );
  }
  fVar4 = fVar7 - fVar3;
  fVar6 = fVar8 - fVar5;
  fVar9 = -fVar4;
  if (-fVar4 <= fVar4) {
    fVar9 = fVar4;
  }
  if (fVar9 <= rounding) {
    rounding = fVar9;
  }
  fVar9 = -fVar6;
  if (-fVar6 <= fVar6) {
    fVar9 = fVar6;
  }
  if (fVar9 <= rounding) {
    rounding = fVar9;
  }
  if ((rounding == 0.0) && (!NAN(rounding))) {
    nk_draw_list_path_line_to(list,a);
    pos_03.y = fVar5;
    pos_03.x = fVar7;
    nk_draw_list_path_line_to(list,pos_03);
    nk_draw_list_path_line_to(list,b);
    pos_04.y = fVar8;
    pos_04.x = fVar3;
    nk_draw_list_path_line_to(list,pos_04);
    return;
  }
  lVar2 = 8;
  do {
    pos.y = list->circle_vtx[lVar2 + -2].y * rounding + fVar5 + rounding;
    pos.x = list->circle_vtx[lVar2 + -2].x * rounding + fVar3 + rounding;
    nk_draw_list_path_line_to(list,pos);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xc);
  lVar2 = 9;
  do {
    lVar1 = lVar2;
    if (lVar2 == 0xc) {
      lVar1 = 0;
    }
    pos_00.y = list->circle_vtx[lVar1].y * rounding + fVar5 + rounding;
    pos_00.x = list->circle_vtx[lVar1].x * rounding + (fVar7 - rounding);
    nk_draw_list_path_line_to(list,pos_00);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xd);
  lVar2 = 2;
  do {
    pos_01.y = list->circle_vtx[lVar2 + -2].y * rounding + (fVar8 - rounding);
    pos_01.x = list->circle_vtx[lVar2 + -2].x * rounding + (fVar7 - rounding);
    nk_draw_list_path_line_to(list,pos_01);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  lVar2 = 5;
  do {
    pos_02.y = list->circle_vtx[lVar2 + -2].y * rounding + (fVar8 - rounding);
    pos_02.x = list->circle_vtx[lVar2 + -2].x * rounding + fVar3 + rounding;
    nk_draw_list_path_line_to(list,pos_02);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 9);
  return;
}

Assistant:

NK_API void
nk_draw_list_path_rect_to(struct nk_draw_list *list, struct nk_vec2 a,
    struct nk_vec2 b, float rounding)
{
    float r;
    NK_ASSERT(list);
    if (!list) return;
    r = rounding;
    r = NK_MIN(r, ((b.x-a.x) < 0) ? -(b.x-a.x): (b.x-a.x));
    r = NK_MIN(r, ((b.y-a.y) < 0) ? -(b.y-a.y): (b.y-a.y));

    if (r == 0.0f) {
        nk_draw_list_path_line_to(list, a);
        nk_draw_list_path_line_to(list, nk_vec2(b.x,a.y));
        nk_draw_list_path_line_to(list, b);
        nk_draw_list_path_line_to(list, nk_vec2(a.x,b.y));
    } else {
        nk_draw_list_path_arc_to_fast(list, nk_vec2(a.x + r, a.y + r), r, 6, 9);
        nk_draw_list_path_arc_to_fast(list, nk_vec2(b.x - r, a.y + r), r, 9, 12);
        nk_draw_list_path_arc_to_fast(list, nk_vec2(b.x - r, b.y - r), r, 0, 3);
        nk_draw_list_path_arc_to_fast(list, nk_vec2(a.x + r, b.y - r), r, 3, 6);
    }
}